

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

FPlayerSoundHashTable * __thiscall
FPlayerSoundHashTable::operator=(FPlayerSoundHashTable *this,FPlayerSoundHashTable *other)

{
  Entry *local_28;
  Entry *entry;
  int i;
  FPlayerSoundHashTable *other_local;
  FPlayerSoundHashTable *this_local;
  
  Free(this);
  for (entry._4_4_ = 0; entry._4_4_ < 0x17; entry._4_4_ = entry._4_4_ + 1) {
    for (local_28 = other->Buckets[entry._4_4_]; local_28 != (Entry *)0x0; local_28 = local_28->Next
        ) {
      AddSound(this,local_28->PlayerSoundID,local_28->SfxID);
    }
  }
  return this;
}

Assistant:

FPlayerSoundHashTable &FPlayerSoundHashTable::operator= (const FPlayerSoundHashTable &other)
{
	Free ();
	for (int i = 0; i < NUM_BUCKETS; ++i)
	{
		Entry *entry;

		for (entry = other.Buckets[i]; entry != NULL; entry = entry->Next)
		{
			AddSound (entry->PlayerSoundID, entry->SfxID);
		}
	}
	return *this;
}